

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu_registers.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_546e0c::PpuVram_equality_Test::TestBody(PpuVram_equality_Test *this)

{
  return;
}

Assistant:

TEST(PpuVram, equality) {
    constexpr PpuVram kV1{0x1234};
    constexpr PpuVram kV2{0x1234};
    constexpr PpuVram kV3{0xABCD};
    EXPECT_TRUE(kV1 == kV2);
    EXPECT_TRUE(kV1 != kV3);
}